

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

int cb_cancel_test(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
                  uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  atomic<unsigned_char> *paVar1;
  
  if (status == 1) {
    paVar1 = &cancel_test_signal_begin;
  }
  else {
    if (status != 0x10) {
      return 0;
    }
    paVar1 = &cancel_test_signal_end;
  }
  LOCK();
  (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x01';
  UNLOCK();
  return 0;
}

Assistant:

static int cb_cancel_test(fdb_file_handle *fhandle,
                          fdb_compaction_status status, const char *kv_name,
                          fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
                          void *ctx)
{
    (void) fhandle;
    (void) kv_name;
    (void) doc;
    (void) old_offset;
    (void) new_offset;
    (void) ctx;

    if (status == FDB_CS_BEGIN) {
        cancel_test_signal_begin = 1;
    } else if (status == FDB_CS_END) {
        cancel_test_signal_end = 1;
    }

    return 0;
}